

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O3

void __thiscall
RTree::k_NN_DF(RTree *this,Point q,int k,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L)

{
  float poor;
  vector<float,_std::allocator<float>_> dk;
  float local_2c;
  vector<float,_std::allocator<float>_> local_28;
  
  local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c = 3.4028235e+38;
  if (this->root != (RTree_node *)0x0) {
    DFT_recursive(this,q,k,this->root,L,&local_28,&local_2c);
    if (local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RTree::k_NN_DF(Point q, int k, std::vector<d_leaf*> &L){
    std::vector<float> dk;
    float poor = std::numeric_limits<float>::max();
    
    if(this->root != nullptr)
        DFT_recursive(q, k, this->root,L,dk,poor);
}